

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaCheckCOSSTDerivedOK
              (xmlSchemaAbstractCtxtPtr actxt,xmlSchemaTypePtr type,xmlSchemaTypePtr baseType,
              int subset)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaTypeLinkPtr pxVar3;
  
  if (type != baseType) {
    if ((((type->type != XML_SCHEMA_TYPE_BASIC) && ((type->flags & 0x400000) == 0)) &&
        (iVar1 = xmlSchemaTypeFixup(type,actxt), iVar1 == -1)) ||
       (((baseType->type != XML_SCHEMA_TYPE_BASIC && ((baseType->flags & 0x400000) == 0)) &&
        (iVar1 = xmlSchemaTypeFixup(baseType,actxt), iVar1 == -1)))) {
      return -1;
    }
    if ((subset & 1U) != 0) {
      return 0xbd7;
    }
    pxVar2 = type->baseType;
    if ((pxVar2 != (xmlSchemaTypePtr)0x0) && ((pxVar2->flags & 0x400) != 0)) {
      return 0xbd7;
    }
    if (((pxVar2 != baseType) &&
        (((pxVar2->type == XML_SCHEMA_TYPE_BASIC && (pxVar2->builtInType == 0x2d)) ||
         (iVar1 = xmlSchemaCheckCOSSTDerivedOK(actxt,pxVar2,baseType,subset), iVar1 != 0)))) &&
       (((baseType->type != XML_SCHEMA_TYPE_BASIC || (baseType->builtInType != 0x2e)) ||
        ((type->flags & 0xc0) == 0)))) {
      if ((baseType->flags & 0x80) == 0) {
        return 0xbd8;
      }
      pxVar3 = (xmlSchemaTypeLinkPtr)&baseType->memberTypes;
      do {
        pxVar3 = pxVar3->next;
        if (pxVar3 == (xmlSchemaTypeLinkPtr)0x0) {
          return 0xbd8;
        }
        pxVar2 = pxVar3->type;
        if ((pxVar2->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar2->flags & 0x400000) == 0)) {
          iVar1 = xmlSchemaTypeFixup(pxVar2,actxt);
          if (iVar1 == -1) {
            return -1;
          }
          pxVar2 = pxVar3->type;
        }
        iVar1 = xmlSchemaCheckCOSSTDerivedOK(actxt,type,pxVar2,subset);
      } while (iVar1 != 0);
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaCheckCOSSTDerivedOK(xmlSchemaAbstractCtxtPtr actxt,
			     xmlSchemaTypePtr type,
			     xmlSchemaTypePtr baseType,
			     int subset)
{
    /*
    * 1 They are the same type definition.
    * TODO: The identity check might have to be more complex than this.
    */
    if (type == baseType)
	return (0);
    /*
    * 2.1 restriction is not in the subset, or in the {final}
    * of its own {base type definition};
    *
    * NOTE that this will be used also via "xsi:type".
    *
    * TODO: Revise this, it looks strange. How can the "type"
    * not be fixed or *in* fixing?
    */
    if (WXS_IS_TYPE_NOT_FIXED(type))
	if (xmlSchemaTypeFixup(type, actxt) == -1)
	    return(-1);
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	if (xmlSchemaTypeFixup(baseType, actxt) == -1)
	    return(-1);
    if ((subset & SUBSET_RESTRICTION) ||
	(xmlSchemaTypeFinalContains(type->baseType,
	    XML_SCHEMAS_TYPE_FINAL_RESTRICTION))) {
	return (XML_SCHEMAP_COS_ST_DERIVED_OK_2_1);
    }
    /* 2.2 */
    if (type->baseType == baseType) {
	/*
	* 2.2.1 D's `base type definition` is B.
	*/
	return (0);
    }
    /*
    * 2.2.2 D's `base type definition` is not the `ur-type definition`
    * and is validly derived from B given the subset, as defined by this
    * constraint.
    */
    if ((! WXS_IS_ANYTYPE(type->baseType)) &&
	(xmlSchemaCheckCOSSTDerivedOK(actxt, type->baseType,
	    baseType, subset) == 0)) {
	return (0);
    }
    /*
    * 2.2.3 D's {variety} is list or union and B is the `simple ur-type
    * definition`.
    */
    if (WXS_IS_ANY_SIMPLE_TYPE(baseType) &&
	(WXS_IS_LIST(type) || WXS_IS_UNION(type))) {
	return (0);
    }
    /*
    * 2.2.4 B's {variety} is union and D is validly derived from a type
    * definition in B's {member type definitions} given the subset, as
    * defined by this constraint.
    *
    * NOTE: This seems not to involve built-in types, since there is no
    * built-in Union Simple Type.
    */
    if (WXS_IS_UNION(baseType)) {
	xmlSchemaTypeLinkPtr cur;

	cur = baseType->memberTypes;
	while (cur != NULL) {
	    if (WXS_IS_TYPE_NOT_FIXED(cur->type))
		if (xmlSchemaTypeFixup(cur->type, actxt) == -1)
		    return(-1);
	    if (xmlSchemaCheckCOSSTDerivedOK(actxt,
		    type, cur->type, subset) == 0)
	    {
		/*
		* It just has to be validly derived from at least one
		* member-type.
		*/
		return (0);
	    }
	    cur = cur->next;
	}
    }
    return (XML_SCHEMAP_COS_ST_DERIVED_OK_2_2);
}